

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_txfm_test.cc
# Opt level: O0

void libaom_test::get_txfm1d_type(TX_TYPE txfm2d_type,TYPE_TXFM *type0,TYPE_TXFM *type1)

{
  TYPE_TXFM *type1_local;
  TYPE_TXFM *type0_local;
  TX_TYPE txfm2d_type_local;
  
  switch(txfm2d_type) {
  case '\0':
    *type0 = '\0';
    *type1 = '\0';
    break;
  case '\x01':
    *type0 = '\x01';
    *type1 = '\0';
    break;
  case '\x02':
    *type0 = '\0';
    *type1 = '\x01';
    break;
  case '\x03':
    *type0 = '\x01';
    *type1 = '\x01';
    break;
  case '\x04':
    *type0 = '\x01';
    *type1 = '\0';
    break;
  case '\x05':
    *type0 = '\0';
    *type1 = '\x01';
    break;
  case '\x06':
    *type0 = '\x01';
    *type1 = '\x01';
    break;
  case '\a':
    *type0 = '\x01';
    *type1 = '\x01';
    break;
  case '\b':
    *type0 = '\x01';
    *type1 = '\x01';
    break;
  case '\t':
    *type0 = '\x02';
    *type1 = '\x02';
    break;
  case '\n':
    *type0 = '\0';
    *type1 = '\x02';
    break;
  case '\v':
    *type0 = '\x02';
    *type1 = '\0';
    break;
  case '\f':
    *type0 = '\x01';
    *type1 = '\x02';
    break;
  case '\r':
    *type0 = '\x02';
    *type1 = '\x01';
    break;
  case '\x0e':
    *type0 = '\x01';
    *type1 = '\x02';
    break;
  case '\x0f':
    *type0 = '\x02';
    *type1 = '\x01';
    break;
  default:
    *type0 = '\0';
    *type1 = '\0';
  }
  return;
}

Assistant:

void get_txfm1d_type(TX_TYPE txfm2d_type, TYPE_TXFM *type0, TYPE_TXFM *type1) {
  switch (txfm2d_type) {
    case DCT_DCT:
      *type0 = TYPE_DCT;
      *type1 = TYPE_DCT;
      break;
    case ADST_DCT:
      *type0 = TYPE_ADST;
      *type1 = TYPE_DCT;
      break;
    case DCT_ADST:
      *type0 = TYPE_DCT;
      *type1 = TYPE_ADST;
      break;
    case ADST_ADST:
      *type0 = TYPE_ADST;
      *type1 = TYPE_ADST;
      break;
    case FLIPADST_DCT:
      *type0 = TYPE_ADST;
      *type1 = TYPE_DCT;
      break;
    case DCT_FLIPADST:
      *type0 = TYPE_DCT;
      *type1 = TYPE_ADST;
      break;
    case FLIPADST_FLIPADST:
      *type0 = TYPE_ADST;
      *type1 = TYPE_ADST;
      break;
    case ADST_FLIPADST:
      *type0 = TYPE_ADST;
      *type1 = TYPE_ADST;
      break;
    case FLIPADST_ADST:
      *type0 = TYPE_ADST;
      *type1 = TYPE_ADST;
      break;
    case IDTX:
      *type0 = TYPE_IDTX;
      *type1 = TYPE_IDTX;
      break;
    case H_DCT:
      *type0 = TYPE_IDTX;
      *type1 = TYPE_DCT;
      break;
    case V_DCT:
      *type0 = TYPE_DCT;
      *type1 = TYPE_IDTX;
      break;
    case H_ADST:
      *type0 = TYPE_IDTX;
      *type1 = TYPE_ADST;
      break;
    case V_ADST:
      *type0 = TYPE_ADST;
      *type1 = TYPE_IDTX;
      break;
    case H_FLIPADST:
      *type0 = TYPE_IDTX;
      *type1 = TYPE_ADST;
      break;
    case V_FLIPADST:
      *type0 = TYPE_ADST;
      *type1 = TYPE_IDTX;
      break;
    default:
      *type0 = TYPE_DCT;
      *type1 = TYPE_DCT;
      assert(0);
      break;
  }
}